

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

void __thiscall GLDrawList::SortSpriteIntoWall(GLDrawList *this,SortNode *head,SortNode *sort)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  GLDrawItem *pGVar6;
  double dVar7;
  uint uVar8;
  SortNode *pSVar9;
  SortNode *child;
  GLSprite *pGVar10;
  GLWall *this_00;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  GLSprite local_d0;
  
  pGVar10 = (this->sprites).Array;
  pGVar6 = (this->drawitems).Array;
  this_00 = (this->walls).Array + pGVar6[head->itemindex].index;
  iVar5 = pGVar6[sort->itemindex].index;
  fVar11 = GLWall::PointOnSide(this_00,pGVar10[iVar5].x1,pGVar10[iVar5].y1);
  fVar12 = GLWall::PointOnSide(this_00,pGVar10[iVar5].x2,pGVar10[iVar5].y2);
  if ((0.0005 <= ABS(fVar11)) || (0.0005 <= ABS(fVar12))) {
    if ((0.0005 <= fVar11) || (0.0005 <= fVar12)) {
      if ((-0.0005 < fVar11) && (-0.0005 < fVar12)) {
        SortNode::AddToRight(head,sort);
        return;
      }
      pGVar10 = pGVar10 + iVar5;
      dVar7 = GLSprite::CalcIntersectionVertex(pGVar10,this_00);
      fVar14 = (float)((double)(pGVar10->ur - pGVar10->ul) * dVar7 + (double)pGVar10->ul);
      uVar1 = pGVar10->x1;
      uVar3 = pGVar10->y1;
      uVar2 = pGVar10->x2;
      uVar4 = pGVar10->y2;
      fVar12 = (float)(dVar7 * (double)((float)uVar2 - (float)uVar1) + (double)(float)uVar1);
      fVar13 = (float)(dVar7 * (double)((float)uVar4 - (float)uVar3) + (double)(float)uVar3);
      memcpy(&local_d0,pGVar10,0xa0);
      AddSprite(this,&local_d0);
      uVar8 = (this->sprites).Count - 1;
      pGVar10 = (this->sprites).Array;
      iVar5 = (this->drawitems).Array[sort->itemindex].index;
      pGVar10[iVar5].x2 = fVar12;
      pGVar10[iVar5].y2 = fVar13;
      pGVar10[uVar8].x1 = fVar12;
      pGVar10[uVar8].y1 = fVar13;
      pGVar10[iVar5].ur = fVar14;
      pGVar10[uVar8].ul = fVar14;
      pSVar9 = StaticSortNodeArray::GetNew(&SortNodes);
      *(undefined8 *)pSVar9 = 0;
      pSVar9->parent = (SortNode *)0x0;
      pSVar9->next = (SortNode *)0x0;
      pSVar9->left = (SortNode *)0x0;
      pSVar9->equal = (SortNode *)0x0;
      pSVar9->right = (SortNode *)0x0;
      child = sort;
      if (0.0 < fVar11) {
        child = pSVar9;
      }
      pSVar9->itemindex = (this->drawitems).Count - 1;
      if (fVar11 <= 0.0) {
        sort = pSVar9;
      }
      SortNode::AddToLeft(head,child);
      SortNode::AddToRight(head,sort);
      return;
    }
  }
  else if (this_00->type != '\x05') {
    SortNode::AddToEqual(head,sort);
    return;
  }
  SortNode::AddToLeft(head,sort);
  return;
}

Assistant:

void GLDrawList::SortSpriteIntoWall(SortNode * head,SortNode * sort)
{
	GLWall * wh=&walls[drawitems[head->itemindex].index];
	GLSprite * ss=&sprites[drawitems[sort->itemindex].index];
	GLSprite * ss1;

	float v1 = wh->PointOnSide(ss->x1, ss->y1);
	float v2 = wh->PointOnSide(ss->x2, ss->y2);

	if (fabs(v1)<MIN_EQ && fabs(v2)<MIN_EQ) 
	{
		if (wh->type==RENDERWALL_FOGBOUNDARY) 
		{
			head->AddToLeft(sort);
		}
		else 
		{
			head->AddToEqual(sort);
		}
	}
	else if (v1<MIN_EQ && v2<MIN_EQ) 
	{
		head->AddToLeft(sort);
	}
	else if (v1>-MIN_EQ && v2>-MIN_EQ) 
	{
		head->AddToRight(sort);
	}
	else
	{
		double r=ss->CalcIntersectionVertex(wh);

		float ix=(float)(ss->x1 + r * (ss->x2-ss->x1));
		float iy=(float)(ss->y1 + r * (ss->y2-ss->y1));
		float iu=(float)(ss->ul + r * (ss->ur-ss->ul));

		GLSprite s=*ss;
		AddSprite(&s);
		ss1=&sprites[sprites.Size()-1];
		ss=&sprites[drawitems[sort->itemindex].index];	// may have been reallocated!

		ss1->x1=ss->x2=ix;
		ss1->y1=ss->y2=iy;
		ss1->ul=ss->ur=iu;

		SortNode * sort2=SortNodes.GetNew();
		memset(sort2,0,sizeof(SortNode));
		sort2->itemindex=drawitems.Size()-1;

		if (v1>0)
		{
			head->AddToLeft(sort2);
			head->AddToRight(sort);
		}
		else
		{
			head->AddToLeft(sort);
			head->AddToRight(sort2);
		}
	}
}